

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<int_(unsigned_int)>::TypedExpectation
          (TypedExpectation<int_(unsigned_int)> *this,FunctionMocker<int_(unsigned_int)> *owner,
          char *a_file,int a_line,string *a_source_text,ArgumentMatcherTuple *m)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_003295a0;
  this->owner_ = owner;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003186e8;
  pVVar1 = (m->super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>).
           super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
           super_MatcherBase<unsigned_int>.vtable_;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.vtable_ = pVVar1;
  pSVar2 = (m->super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>).
           super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
           super_MatcherBase<unsigned_int>.buffer_.shared;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.buffer_.shared = pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00318740;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<unsigned_int>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<unsigned_int>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<unsigned_int>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<unsigned_int>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0031d7c8;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}